

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::DepthDrawCase::init(DepthDrawCase *this,EVP_PKEY_CTX *ctx)

{
  pointer pLVar1;
  undefined8 *puVar2;
  float *pfVar3;
  undefined1 *this_00;
  BBoxState BVar4;
  int iVar5;
  Context *pCVar6;
  TestLog *pTVar7;
  pointer pLVar8;
  pointer pLVar9;
  int iVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> data;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  data_00;
  bool bVar13;
  bool bVar14;
  int iVar15;
  ContextType ctxType;
  deUint32 dVar16;
  undefined4 extraout_var;
  RenderTarget *pRVar17;
  ostream *poVar18;
  ProgramSources *this_01;
  ShaderProgram *this_02;
  ulong uVar19;
  TypedObjectWrapper<(glu::ObjectType)1> *this_03;
  ulong uVar20;
  pointer pLVar21;
  LayerInfo *pLVar22;
  NotSupportedError *pNVar23;
  TestError *this_04;
  ulong uVar24;
  ScopedLogSection *pSVar25;
  int layerNdx;
  allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo> *extraout_RDX
  ;
  uint max;
  int iVar26;
  char *pcVar27;
  LayerInfo *pLVar28;
  char *pcVar29;
  BBoxState *pBVar30;
  int ndx;
  long lVar31;
  long lVar32;
  long lVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined4 uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  undefined4 uVar49;
  ShaderProgram *in_stack_fffffffffffffc78;
  undefined8 in_stack_fffffffffffffc80;
  string local_378;
  undefined1 local_358 [8];
  _Alloc_hider _Stack_350;
  ScopedLogSection section;
  _Alloc_hider _Stack_320;
  ulong local_300;
  ulong local_2f8;
  LayerInfo *local_2f0;
  string local_2e8;
  ostringstream buf;
  ProgramSources sources;
  int local_70;
  undefined4 uStack_6c;
  string local_50;
  
  iVar15 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar33 = CONCAT44(extraout_var,iVar15);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar13 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar13) {
    bVar14 = glu::ContextInfo::isExtensionSupported
                       (((this->super_TestCase).m_context)->m_contextInfo,
                        "GL_EXT_primitive_bounding_box");
    if (!bVar14) {
      pNVar23 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buf,"Test requires GL_EXT_primitive_bounding_box extension",
                 (allocator<char> *)&sources);
      tcu::NotSupportedError::NotSupportedError(pNVar23,(string *)&buf);
      __cxa_throw(pNVar23,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    if ((!bVar13 && this->m_state == STATE_PER_PRIMITIVE) &&
       (bVar13 = glu::ContextInfo::isExtensionSupported
                           (((this->super_TestCase).m_context)->m_contextInfo,
                            "GL_EXT_tessellation_shader"), !bVar13)) {
      pNVar23 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buf,"Test requires GL_EXT_tessellation_shader extension",
                 (allocator<char> *)&sources);
      tcu::NotSupportedError::NotSupportedError(pNVar23,(string *)&buf);
      __cxa_throw(pNVar23,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  pBVar30 = &this->m_state;
  pRVar17 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (pRVar17->m_depthBits == 0) {
    pNVar23 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"Test requires depth buffer",(allocator<char> *)&sources);
    tcu::NotSupportedError::NotSupportedError(pNVar23,(string *)&buf);
    __cxa_throw(pNVar23,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pRVar17 = Context::getRenderTarget((this->super_TestCase).m_context);
  if ((pRVar17->m_width < 0x100) ||
     (pRVar17 = Context::getRenderTarget((this->super_TestCase).m_context),
     pRVar17->m_height < 0x100)) {
    pNVar23 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_50._M_dataplus._M_p._0_4_ = 0x100;
    de::toString<int>(&local_378,(int *)&local_50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   "Test requires ",&local_378);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,"x"
                  );
    local_70 = 0x100;
    de::toString<int>(&local_2e8,&local_70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sources,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                   &local_2e8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sources,
                   " viewport");
    tcu::NotSupportedError::NotSupportedError(pNVar23,(string *)&buf);
    __cxa_throw(pNVar23,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,
                  "Rendering multiple triangle grids with with different z coordinates.\n");
  std::operator<<((ostream *)this_00,"Topmost grid is green-yellow, other grids are blue-red.\n");
  std::operator<<((ostream *)this_00,"Expecting only the green-yellow grid to be visible.\n");
  std::operator<<((ostream *)this_00,"Setting primitive bounding box ");
  pcVar27 = "to cover";
  if (this->m_bboxSize == BBOX_EQUAL) {
    pcVar27 = "to exactly cover";
  }
  std::operator<<((ostream *)this_00,pcVar27);
  pcVar27 = " each triangle";
  if (*pBVar30 == STATE_GLOBAL) {
    pcVar27 = " each grid";
  }
  std::operator<<((ostream *)this_00,pcVar27);
  pcVar27 = " and include some padding.";
  if (this->m_bboxSize == BBOX_EQUAL) {
    pcVar27 = ".";
  }
  std::operator<<((ostream *)this_00,pcVar27);
  std::operator<<((ostream *)this_00,"\n");
  std::operator<<((ostream *)this_00,"Set bounding box using ");
  pcVar27 = "gl_BoundingBoxEXT output";
  if (*pBVar30 == STATE_GLOBAL) {
    pcVar27 = "PRIMITIVE_BOUNDING_BOX_EXT state";
  }
  std::operator<<((ostream *)this_00,pcVar27);
  std::operator<<((ostream *)this_00,"\n");
  pcVar27 = glcts::fixed_sample_locations_values + 1;
  if (this->m_depthType == DEPTH_USER_DEFINED) {
    pcVar27 = "Fragment depth is set in the fragment shader";
  }
  std::operator<<((ostream *)this_00,pcVar27);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  memset(&sources,0,0xac);
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  sources._193_8_ = 0;
  pCVar6 = (this->super_TestCase).m_context;
  BVar4 = this->m_state;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                  "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_colorMix;\nout highp vec4 vtx_colorMix;\n"
                 );
  if ((BVar4 == STATE_PER_PRIMITIVE) || (this->m_depthType != DEPTH_USER_DEFINED)) {
    if (BVar4 == STATE_PER_PRIMITIVE) goto LAB_013954b0;
  }
  else {
    std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                    "out highp float v_fragDepth;\n");
  }
  std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                  "uniform highp float u_depthBias;\nuniform highp float u_depthScale;\n");
LAB_013954b0:
  std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"\nvoid main()\n{\n");
  pcVar27 = 
  "\thighp float writtenZ = a_position.w;\n\tgl_Position = vec4(a_position.xy, writtenZ * u_depthScale + u_depthBias, 1.0);\n"
  ;
  if (this->m_depthType == DEPTH_USER_DEFINED) {
    pcVar27 = 
    "\thighp float dummyZ = a_position.z;\n\thighp float writtenZ = a_position.w;\n\tgl_Position = vec4(a_position.xy, dummyZ, 1.0);\n\tv_fragDepth = writtenZ * u_depthScale + u_depthBias;\n"
    ;
  }
  pcVar29 = "\tgl_Position = a_position;\n";
  if (BVar4 != STATE_PER_PRIMITIVE) {
    pcVar29 = pcVar27;
  }
  std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,pcVar29);
  std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                  "\tvtx_colorMix = a_colorMix;\n}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)&section,(_anonymous_namespace_ *)pCVar6,
             (Context *)local_378._M_dataplus._M_p,pcVar27);
  glu::VertexSource::VertexSource((VertexSource *)local_358,(string *)&section);
  glu::ProgramSources::operator<<(&sources,(ShaderSource *)local_358);
  std::__cxx11::string::~string((string *)&_Stack_350);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&local_378);
  pCVar6 = (this->super_TestCase).m_context;
  pcVar29 = "vtx_colorMix";
  if (this->m_state == STATE_PER_PRIMITIVE) {
    pcVar29 = "tess_eval_colorMix";
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  poVar18 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                            "${GLSL_VERSION_DECL}\nin mediump vec4 ");
  poVar18 = std::operator<<(poVar18,pcVar29);
  std::operator<<(poVar18,";\n");
  if (this->m_depthType == DEPTH_USER_DEFINED) {
    std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                    "in mediump float v_fragDepth;\n");
  }
  poVar18 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                            "layout(location = 0) out mediump vec4 o_color;\nuniform highp vec4 u_color1;\nuniform highp vec4 u_color2;\n\nvoid main()\n{\n\to_color = mix(u_color1, u_color2, "
                           );
  poVar18 = std::operator<<(poVar18,pcVar29);
  std::operator<<(poVar18,");\n");
  if (this->m_depthType == DEPTH_USER_DEFINED) {
    std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                    "\tgl_FragDepth = v_fragDepth * 0.5 + 0.5;\n");
  }
  std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)&section,(_anonymous_namespace_ *)pCVar6,
             (Context *)local_378._M_dataplus._M_p,pcVar27);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_358,(string *)&section);
  glu::ProgramSources::operator<<(&sources,(ShaderSource *)local_358);
  std::__cxx11::string::~string((string *)&_Stack_350);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&local_378);
  if (*pBVar30 == STATE_PER_PRIMITIVE) {
    pCVar6 = (this->super_TestCase).m_context;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
    std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                    "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n${PRIMITIVE_BOUNDING_BOX_REQUIRE}\nlayout(vertices=3) out;\n\nuniform highp float u_depthBias;\nuniform highp float u_depthScale;\n\nin highp vec4 vtx_colorMix[];\nout highp vec4 tess_ctrl_colorMix[];\n\nvoid main()\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n\ttess_ctrl_colorMix[gl_InvocationID] = vtx_colorMix[0];\n\n\tgl_TessLevelOuter[0] = 2.8;\n\tgl_TessLevelOuter[1] = 2.8;\n\tgl_TessLevelOuter[2] = 2.8;\n\tgl_TessLevelInner[0] = 2.8;\n\n\t// real Z stored in w component\n\thighp vec4 minBound = vec4(min(min(vec3(gl_in[0].gl_Position.xy, gl_in[0].gl_Position.w * u_depthScale + u_depthBias),\n\t                                   vec3(gl_in[1].gl_Position.xy, gl_in[1].gl_Position.w * u_depthScale + u_depthBias)),\n\t                               vec3(gl_in[2].gl_Position.xy, gl_in[2].gl_Position.w * u_depthScale + u_depthBias)), 1.0);\n\thighp vec4 maxBound = vec4(max(max(vec3(gl_in[0].gl_Position.xy, gl_in[0].gl_Position.w * u_depthScale + u_depthBias),\n\t                                   vec3(gl_in[1].gl_Position.xy, gl_in[1].gl_Position.w * u_depthScale + u_depthBias)),\n\t                               vec3(gl_in[2].gl_Position.xy, gl_in[2].gl_Position.w * u_depthScale + u_depthBias)), 1.0);\n"
                   );
    pcVar29 = 
    "\thighp float nedPadding = mod(gl_in[0].gl_Position.z, 0.3);\n\thighp float posPadding = mod(gl_in[1].gl_Position.z, 0.3);\n\t${PRIM_GL_BOUNDING_BOX}[0] = minBound - vec4(0.0, 0.0, nedPadding, 0.0);\n\t${PRIM_GL_BOUNDING_BOX}[1] = maxBound + vec4(0.0, 0.0, posPadding, 0.0);\n"
    ;
    if (this->m_bboxSize == BBOX_EQUAL) {
      pcVar29 = 
      "\t${PRIM_GL_BOUNDING_BOX}[0] = minBound;\n\t${PRIM_GL_BOUNDING_BOX}[1] = maxBound;\n";
    }
    std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,pcVar29);
    std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_378,(_anonymous_namespace_ *)pCVar6,(Context *)local_2e8._M_dataplus._M_p,
               pcVar27);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)local_358,&local_378);
    this_01 = glu::ProgramSources::operator<<(&sources,(ShaderSource *)local_358);
    pCVar6 = (this->super_TestCase).m_context;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
    std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                    "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n${GPU_SHADER5_REQUIRE}\nlayout(triangles) in;\n\nin highp vec4 tess_ctrl_colorMix[];\nout highp vec4 tess_eval_colorMix;\n"
                   );
    if (this->m_depthType == DEPTH_USER_DEFINED) {
      std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                      "out highp float v_fragDepth;\n");
    }
    std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                    "uniform highp float u_depthBias;\nuniform highp float u_depthScale;\n\nprecise gl_Position;\n\nvoid main()\n{\n\thighp vec4 tessellatedPos = gl_TessCoord.x * gl_in[0].gl_Position + gl_TessCoord.y * gl_in[1].gl_Position + gl_TessCoord.z * gl_in[2].gl_Position;\n"
                   );
    pcVar29 = 
    "\thighp float writtenZ = tessellatedPos.w;\n\tgl_Position = vec4(tessellatedPos.xy, writtenZ * u_depthScale + u_depthBias, 1.0);\n"
    ;
    if (this->m_depthType == DEPTH_USER_DEFINED) {
      pcVar29 = 
      "\thighp float dummyZ = tessellatedPos.z;\n\thighp float writtenZ = tessellatedPos.w;\n\tgl_Position = vec4(tessellatedPos.xy, dummyZ, 1.0);\n\tv_fragDepth = writtenZ * u_depthScale + u_depthBias;\n"
      ;
    }
    std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,pcVar29);
    std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                    "\ttess_eval_colorMix = tess_ctrl_colorMix[0];\n}\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)pCVar6,(Context *)CONCAT44(uStack_6c,local_70),
               pcVar27);
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)&section,&local_50);
    glu::ProgramSources::operator<<(this_01,(ShaderSource *)&section);
    std::__cxx11::string::~string((string *)&_Stack_320);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&_Stack_350);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_2e8);
  }
  this_02 = (ShaderProgram *)operator_new(0xd0);
  glu::ShaderProgram::ShaderProgram
            (this_02,((this->super_TestCase).m_context)->m_renderCtx,&sources);
  buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = (_func_int **)0x0;
  data._8_8_ = in_stack_fffffffffffffc80;
  data.ptr = in_stack_fffffffffffffc78;
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::assignData
            (&(this->m_program).
              super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>,data);
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::~UniqueBase
            ((UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)&buf);
  dVar16 = (**(code **)(lVar33 + 0x800))();
  glu::checkError(dVar16,"build program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0xeca);
  pTVar7 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"ShaderProgram",(allocator<char> *)&local_378);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_358,"Shader program",(allocator<char> *)&local_2e8);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar7,(string *)&buf,(string *)local_358);
  std::__cxx11::string::~string((string *)local_358);
  std::__cxx11::string::~string((string *)&buf);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).
                  super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
                  m_data.ptr);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  if ((((this->m_program).
        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.ptr)->
      m_program).m_info.linkOk == false) {
    this_04 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"failed to build program",(allocator<char> *)local_358);
    tcu::TestError::TestError(this_04,(string *)&buf);
    __cxa_throw(this_04,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  glu::ProgramSources::~ProgramSources(&sources);
  sources.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sources.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sources.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358 = (undefined1  [8])0x0;
  _Stack_350._M_p = (pointer)0x0;
  section.m_log = (TestLog *)0x3f8000003f800000;
  _Stack_320._M_p = (pointer)0x3f8000003f800000;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&buf,(long)(this->m_gridSize * this->m_gridSize),
             (allocator_type *)&local_378);
  deRandom_init((deRandom *)&local_378,0xab54321);
  uVar19 = (ulong)(buf.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ -
                  (long)buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream)
           >> 2;
  uVar24 = 0;
  uVar20 = uVar19 & 0xffffffff;
  if ((int)uVar19 < 1) {
    uVar20 = uVar24;
  }
  for (; uVar20 != uVar24; uVar24 = uVar24 + 1) {
    *(int *)((long)buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream +
            uVar24 * 4) = (int)uVar24;
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)&local_378,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             buf.super_basic_ostream<char,_std::char_traits<char>_>._8_8_);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&sources,
             (long)(this->m_gridSize * this->m_gridSize * 0xc));
  iVar15 = 0;
  for (lVar31 = 0;
      lVar31 < (int)((ulong)(buf.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ -
                            (long)buf.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream) >> 2); lVar31 = lVar31 + 1) {
    iVar5 = *(int *)((long)buf.super_basic_ostream<char,_std::char_traits<char>_>.
                           _vptr_basic_ostream + lVar31 * 4);
    iVar26 = this->m_gridSize;
    iVar10 = iVar5 / iVar26;
    iVar5 = iVar5 % iVar26;
    pSVar25 = &section;
    if ((iVar10 + iVar5 & 1U) == 0) {
      pSVar25 = (ScopedLogSection *)local_358;
    }
    auVar36._0_4_ = (float)iVar26;
    iVar26 = (int)lVar31 * 0xc;
    auVar35._4_4_ = (float)iVar10;
    uVar20 = CONCAT44(auVar35._4_4_,(float)iVar5);
    auVar36._4_4_ = auVar36._0_4_;
    auVar36._8_4_ = auVar36._0_4_;
    auVar36._12_4_ = auVar36._0_4_;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar20;
    auVar44 = divps(auVar43,auVar36);
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)[(long)iVar26 * 2]._M_p =
         (pointer)CONCAT44(auVar44._4_4_ + auVar44._4_4_ + -1.0,auVar44._0_4_ + auVar44._0_4_ + -1.0
                          );
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus + (long)iVar26 * 2)[1] = (pointer)0x0
    ;
    pTVar7 = pSVar25[1].m_log;
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)[(long)(iVar26 + 1) * 2]._M_p =
         (pointer)pSVar25->m_log;
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus + (long)(iVar26 + 1) * 2)[1] =
         (_Alloc_hider)pTVar7;
    auVar45._0_4_ = (float)this->m_gridSize;
    auVar37._0_8_ = CONCAT44((float)(iVar10 + 1),(float)(iVar5 + 1));
    auVar37._8_4_ = 0x3f800000;
    auVar37._12_4_ = 0x3f800000;
    auVar45._4_4_ = auVar45._0_4_;
    auVar45._8_4_ = auVar45._0_4_;
    auVar45._12_4_ = auVar45._0_4_;
    auVar38._8_4_ = 0x3f800000;
    auVar38._0_8_ = auVar37._0_8_;
    auVar38._12_4_ = 0x3f800000;
    auVar44 = divps(auVar38,auVar45);
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)[(long)(iVar26 + 2) * 2]._M_p =
         (pointer)CONCAT44(auVar44._4_4_ + auVar44._4_4_ + -1.0,auVar44._0_4_ + auVar44._0_4_ + -1.0
                          );
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus + (long)(iVar26 + 2) * 2)[1] =
         (pointer)0x0;
    pTVar7 = pSVar25[1].m_log;
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)[(long)(iVar26 + 3) * 2]._M_p =
         (pointer)pSVar25->m_log;
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus + (long)(iVar26 + 3) * 2)[1] =
         (_Alloc_hider)pTVar7;
    auVar39._0_4_ = (float)this->m_gridSize;
    auVar46._4_4_ = (float)(iVar10 + 1);
    auVar46._0_4_ = (float)iVar5;
    auVar46._8_8_ = 0;
    auVar39._4_4_ = auVar39._0_4_;
    auVar39._8_4_ = auVar39._0_4_;
    auVar39._12_4_ = auVar39._0_4_;
    auVar44 = divps(auVar46,auVar39);
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)[(long)(iVar26 + 4) * 2]._M_p =
         (pointer)CONCAT44(auVar44._4_4_ + auVar44._4_4_ + -1.0,auVar44._0_4_ + auVar44._0_4_ + -1.0
                          );
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus + (long)(iVar26 + 4) * 2)[1] =
         (pointer)0x0;
    pTVar7 = pSVar25[1].m_log;
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)[(long)(iVar26 + 5) * 2]._M_p =
         (pointer)pSVar25->m_log;
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus + (long)(iVar26 + 5) * 2)[1] =
         (_Alloc_hider)pTVar7;
    auVar40._0_4_ = (float)this->m_gridSize;
    auVar40._4_4_ = auVar40._0_4_;
    auVar40._8_4_ = auVar40._0_4_;
    auVar40._12_4_ = auVar40._0_4_;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar20;
    auVar44 = divps(auVar47,auVar40);
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)[(long)(iVar26 + 6) * 2]._M_p =
         (pointer)CONCAT44(auVar44._4_4_ + auVar44._4_4_ + -1.0,auVar44._0_4_ + auVar44._0_4_ + -1.0
                          );
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus + (long)(iVar26 + 6) * 2)[1] =
         (pointer)0x0;
    pTVar7 = pSVar25[1].m_log;
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)[(long)(iVar26 + 7) * 2]._M_p =
         (pointer)pSVar25->m_log;
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus + (long)(iVar26 + 7) * 2)[1] =
         (_Alloc_hider)pTVar7;
    auVar41._0_4_ = (float)this->m_gridSize;
    auVar35._0_4_ = (float)(iVar5 + 1);
    auVar35._8_4_ = 0x3f800000;
    auVar35._12_4_ = 0x3f800000;
    auVar41._4_4_ = auVar41._0_4_;
    auVar41._8_4_ = auVar41._0_4_;
    auVar41._12_4_ = auVar41._0_4_;
    auVar35 = divps(auVar35,auVar41);
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)[(long)(iVar26 + 8) * 2]._M_p =
         (pointer)CONCAT44(auVar35._4_4_ + auVar35._4_4_ + -1.0,auVar35._0_4_ + auVar35._0_4_ + -1.0
                          );
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus + (long)(iVar26 + 8) * 2)[1] =
         (pointer)0x0;
    pTVar7 = pSVar25[1].m_log;
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)[(long)(iVar26 + 9) * 2]._M_p =
         (pointer)pSVar25->m_log;
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus + (long)(iVar26 + 9) * 2)[1] =
         (_Alloc_hider)pTVar7;
    auVar44._0_4_ = (float)this->m_gridSize;
    auVar44._4_4_ = auVar44._0_4_;
    auVar44._8_4_ = auVar44._0_4_;
    auVar44._12_4_ = auVar44._0_4_;
    auVar35 = divps(auVar37,auVar44);
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)[(long)(iVar26 + 10) * 2]._M_p =
         (pointer)CONCAT44(auVar35._4_4_ + auVar35._4_4_ + -1.0,auVar35._0_4_ + auVar35._0_4_ + -1.0
                          );
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus + (long)(iVar26 + 10) * 2)[1] =
         (pointer)0x0;
    pTVar7 = pSVar25[1].m_log;
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)[(long)(iVar26 + 0xb) * 2]._M_p =
         (pointer)pSVar25->m_log;
    (&(sources.sources[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus + (long)(iVar26 + 0xb) * 2)[1] =
         (_Alloc_hider)pTVar7;
    for (lVar32 = 0; lVar32 != 0xc; lVar32 = lVar32 + 2) {
      fVar34 = deRandom_getFloat((deRandom *)&local_378);
      *(float *)(&(sources.sources[0].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                (long)((int)lVar32 + iVar15) * 2) = fVar34 + 0.0;
    }
    for (lVar32 = 0; lVar32 != 0xc; lVar32 = lVar32 + 2) {
      fVar34 = deRandom_getFloat((deRandom *)&local_378);
      *(float *)((long)&(sources.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                (long)((int)lVar32 + iVar15) * 0x10 + 4) = fVar34 + 0.0;
    }
    iVar15 = iVar15 + 0xc;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&buf);
  this_03 = (TypedObjectWrapper<(glu::ObjectType)1> *)operator_new(0x18);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (this_03,((this->super_TestCase).m_context)->m_renderCtx);
  buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = (_func_int **)0x0;
  data_00._8_8_ = lVar33;
  data_00.ptr = (TypedObjectWrapper<(glu::ObjectType)1> *)in_stack_fffffffffffffc78;
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  ::assignData(&(this->m_vbo).
                super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
               ,data_00);
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  ::~UniqueBase((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                 *)&buf);
  (**(code **)(lVar33 + 0x40))
            (0x8892,(((this->m_vbo).
                      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                      .m_data.ptr)->super_ObjectWrapper).m_object);
  (**(code **)(lVar33 + 0x150))
            (0x8892,(long)((int)sources.sources[0].
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (int)sources.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0,
             sources.sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0x88e4);
  dVar16 = (**(code **)(lVar33 + 0x800))();
  glu::checkError(dVar16,"buf upload",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0xedd);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &sources);
  deRandom_init((deRandom *)&sources,0x12345);
  uVar19 = (ulong)this->m_numLayers;
  pLVar8 = (this->m_layers).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar22 = (this->m_layers).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  lVar33 = (long)pLVar22 - (long)pLVar8;
  uVar20 = lVar33 / 0x28;
  uVar24 = uVar19 - uVar20;
  if (uVar19 < uVar20 || uVar24 == 0) {
    if ((uVar19 < uVar20) && (pLVar28 = pLVar8 + uVar19, pLVar22 != pLVar28)) {
      (this->m_layers).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = pLVar28;
    }
  }
  else {
    lVar31 = (long)(this->m_layers).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pLVar22;
    if ((ulong)(lVar31 / 0x28) < uVar24) {
      if (0x333333333333333 - uVar20 < uVar24) {
        std::__throw_length_error("vector::_M_default_append");
      }
      local_300 = uVar24;
      if (uVar24 < uVar20) {
        local_300 = uVar20;
      }
      local_300 = local_300 + uVar20;
      if (0x333333333333332 < local_300) {
        local_300 = 0x333333333333333;
      }
      local_300 = local_300 * 0x28;
      pLVar21 = (pointer)operator_new(local_300);
      local_2f0 = (LayerInfo *)(lVar33 + (long)pLVar21);
      local_2f8 = uVar24;
      std::
      __uninitialized_default_n_a<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo*,unsigned_long,deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>
                (local_2f0,uVar24,extraout_RDX);
      pLVar8 = (this->m_layers).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pLVar9 = (this->m_layers).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (lVar33 = 0; pLVar1 = (pointer)((long)(pLVar8->color1).m_data + lVar33 + -8),
          pLVar1 != pLVar9; lVar33 = lVar33 + 0x28) {
        puVar2 = (undefined8 *)((long)(pLVar21->color1).m_data + lVar33 + -8);
        *puVar2 = *(undefined8 *)pLVar1;
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(puVar2 + 1),&pLVar1->color1);
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(puVar2 + 3),&pLVar1->color2);
      }
      pLVar8 = (this->m_layers).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar33 = (long)(this->m_layers).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pLVar8;
      std::
      _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
      ::_M_deallocate((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                       *)pLVar8,(pointer)(lVar33 / 0x28),lVar33 % 0x28);
      (this->m_layers).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = pLVar21;
      (this->m_layers).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = local_2f0 + local_2f8;
      (this->m_layers).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)(pLVar21->color1).m_data + (local_300 - 8));
    }
    else {
      pLVar22 = std::
                __uninitialized_default_n_a<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo*,unsigned_long,deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>
                          (pLVar22,uVar24,
                           (allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>
                            *)(lVar31 % 0x28));
      (this->m_layers).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = pLVar22;
    }
  }
  lVar33 = 0;
  for (lVar31 = 0; lVar31 < this->m_numLayers; lVar31 = lVar31 + 1) {
    fVar48 = (float)this->m_numLayers;
    fVar34 = (float)(int)lVar31 / fVar48;
    pLVar8 = (this->m_layers).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(float *)((long)(pLVar8->color1).m_data + lVar33 + -8) = fVar34 + fVar34 + -1.0;
    *(float *)((long)(pLVar8->color1).m_data + lVar33 + -4) = 2.0 / fVar48;
    uVar42 = 0;
    uVar49 = 0x3f800000;
    if (lVar33 == 0) {
      uVar49 = 0;
      uVar42 = 0x3f800000;
    }
    *(undefined4 *)((long)(pLVar8->color1).m_data + lVar33) = 0;
    *(undefined4 *)((long)(pLVar8->color1).m_data + lVar33 + 4) = uVar42;
    *(undefined4 *)((long)(pLVar8->color1).m_data + lVar33 + 8) = uVar49;
    *(undefined4 *)((long)(pLVar8->color1).m_data + lVar33 + 0xc) = 0x3f800000;
    pLVar8 = (this->m_layers).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)(pLVar8->color2).m_data + lVar33) = 0x3f800000;
    *(undefined4 *)((long)(pLVar8->color2).m_data + lVar33 + 4) = uVar42;
    *(undefined4 *)((long)(pLVar8->color2).m_data + lVar33 + 8) = uVar49;
    *(undefined4 *)((long)(pLVar8->color2).m_data + lVar33 + 0xc) = 0x3f800000;
    lVar33 = lVar33 + 0x28;
  }
  pLVar8 = (this->m_layers).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar33 = ((long)(this->m_layers).
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar8) / 0x28;
  lVar31 = lVar33;
  while( true ) {
    lVar33 = lVar33 + -1;
    max = (uint)lVar33;
    if ((int)max < 1) break;
    iVar15 = de::Random::getInt((Random *)&sources,0,max);
    buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         *(_func_int ***)((long)(&pLVar8[max & 0x7fffffff].color1 + -1) + 8);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)&buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8
               ,&pLVar8[max & 0x7fffffff].color1);
    pLVar21 = pLVar8 + (max & 0x7fffffff);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)
               &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x18,&pLVar21->color2);
    *(undefined8 *)((pLVar21->color2).m_data + 2) =
         *(undefined8 *)(pLVar8[iVar15].color2.m_data + 2);
    pLVar9 = pLVar8 + iVar15;
    fVar34 = pLVar9->zOffset;
    fVar48 = pLVar9->zScale;
    uVar11 = *(undefined8 *)(pLVar9->color1).m_data;
    pfVar3 = pLVar8[iVar15].color1.m_data + 2;
    uVar12 = *(undefined8 *)(pfVar3 + 2);
    *(undefined8 *)((pLVar21->color1).m_data + 2) = *(undefined8 *)pfVar3;
    *(undefined8 *)(pLVar21->color2).m_data = uVar12;
    pLVar21->zOffset = fVar34;
    pLVar21->zScale = fVar48;
    *(undefined8 *)(pLVar21->color1).m_data = uVar11;
    pLVar9 = pLVar8 + iVar15;
    *(_func_int ***)pLVar9 =
         buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
    (pLVar9->color1).m_data[0] = (float)buf.super_basic_ostream<char,_std::char_traits<char>_>._8_4_
    ;
    (pLVar9->color1).m_data[1] =
         (float)buf.super_basic_ostream<char,_std::char_traits<char>_>._12_4_;
    pfVar3 = pLVar8[iVar15].color1.m_data + 2;
    pfVar3[0] = (float)buf.super_basic_ostream<char,_std::char_traits<char>_>._16_4_;
    pfVar3[1] = (float)buf.super_basic_ostream<char,_std::char_traits<char>_>._20_4_;
    *(undefined8 *)(pfVar3 + 2) = buf.super_basic_ostream<char,_std::char_traits<char>_>._24_8_;
    pLVar8[iVar15].color2.m_data[2] =
         (float)buf.super_basic_ostream<char,_std::char_traits<char>_>._32_4_;
    pLVar8[iVar15].color2.m_data[3] =
         (float)buf.super_basic_ostream<char,_std::char_traits<char>_>._36_4_;
    lVar31 = buf.super_basic_ostream<char,_std::char_traits<char>_>._32_8_;
  }
  return (int)lVar31;
}

Assistant:

void DepthDrawCase::init (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const bool				supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	// requirements

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_primitive_bounding_box"))
		throw tcu::NotSupportedError("Test requires GL_EXT_primitive_bounding_box extension");
	if (m_state == STATE_PER_PRIMITIVE && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension");
	if (m_context.getRenderTarget().getDepthBits() == 0)
		throw tcu::NotSupportedError("Test requires depth buffer");
	if (m_context.getRenderTarget().getWidth() < RENDER_AREA_SIZE || m_context.getRenderTarget().getHeight() < RENDER_AREA_SIZE)
		throw tcu::NotSupportedError("Test requires " + de::toString<int>(RENDER_AREA_SIZE) + "x" + de::toString<int>(RENDER_AREA_SIZE) + " viewport");

	// log
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Rendering multiple triangle grids with with different z coordinates.\n"
		<< "Topmost grid is green-yellow, other grids are blue-red.\n"
		<< "Expecting only the green-yellow grid to be visible.\n"
		<< "Setting primitive bounding box "
			<< ((m_bboxSize == BBOX_EQUAL) ? ("to exactly cover") : ("to cover"))
			<< ((m_state == STATE_GLOBAL) ? (" each grid") : (" each triangle"))
			<< ((m_bboxSize == BBOX_EQUAL) ? (".") : (" and include some padding."))
			<< "\n"
		<< "Set bounding box using "
			<< ((m_state == STATE_GLOBAL) ? ("PRIMITIVE_BOUNDING_BOX_EXT state") : ("gl_BoundingBoxEXT output"))
			<< "\n"
		<< ((m_depthType == DEPTH_USER_DEFINED) ? ("Fragment depth is set in the fragment shader") : (""))
		<< tcu::TestLog::EndMessage;

	// resources

	{
		glu::ProgramSources sources;
		sources << glu::VertexSource(specializeShader(m_context, genVertexSource().c_str()));
		sources << glu::FragmentSource(specializeShader(m_context, genFragmentSource().c_str()));

		if (m_state == STATE_PER_PRIMITIVE)
			sources << glu::TessellationControlSource(specializeShader(m_context, genTessellationControlSource().c_str()))
					<< glu::TessellationEvaluationSource(specializeShader(m_context, genTessellationEvaluationSource().c_str()));

		m_program = de::MovePtr<glu::ShaderProgram>(new glu::ShaderProgram(m_context.getRenderContext(), sources));
		GLU_EXPECT_NO_ERROR(gl.getError(), "build program");

		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "ShaderProgram", "Shader program");
			m_testCtx.getLog() << *m_program;
		}

		if (!m_program->isOk())
			throw tcu::TestError("failed to build program");
	}

	{
		std::vector<tcu::Vec4> data;

		generateAttributeData(data);

		m_vbo = de::MovePtr<glu::Buffer>(new glu::Buffer(m_context.getRenderContext()));
		gl.bindBuffer(GL_ARRAY_BUFFER, **m_vbo);
		gl.bufferData(GL_ARRAY_BUFFER, (int)(sizeof(tcu::Vec4) * data.size()), &data[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "buf upload");
	}

	// gen layers
	{
		de::Random rnd(0x12345);

		m_layers.resize(m_numLayers);
		for (int layerNdx = 0; layerNdx < m_numLayers; ++layerNdx)
		{
			m_layers[layerNdx].zOffset	= ((float)layerNdx / (float)m_numLayers) * 2.0f - 1.0f;
			m_layers[layerNdx].zScale	= (2.0f / (float)m_numLayers);
			m_layers[layerNdx].color1	= (layerNdx == 0) ? (tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f)) : (tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));
			m_layers[layerNdx].color2	= (layerNdx == 0) ? (tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f)) : (tcu::Vec4(1.0f, 0.0f, 1.0f, 1.0f));
		}
		rnd.shuffle(m_layers.begin(), m_layers.end());
	}
}